

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inflate.c
# Opt level: O1

int cm_zlib_inflateUndermine(z_streamp strm,int subvert)

{
  internal_state *piVar1;
  int iVar2;
  int iVar3;
  
  iVar2 = inflateStateCheck(strm);
  iVar3 = -2;
  if (iVar2 == 0) {
    piVar1 = strm->state;
    piVar1[1].dyn_ltree[0xf5].fc = (anon_union_2_2_314cc5cc_for_fc)0x1;
    piVar1[1].dyn_ltree[0xf5].dl = (anon_union_2_2_43a7fb4f_for_dl)0x0;
    iVar3 = -3;
  }
  return iVar3;
}

Assistant:

int ZEXPORT inflateUndermine(strm, subvert)
z_streamp strm;
int subvert;
{
    struct inflate_state FAR *state;

    if (inflateStateCheck(strm)) return Z_STREAM_ERROR;
    state = (struct inflate_state FAR *)strm->state;
#ifdef INFLATE_ALLOW_INVALID_DISTANCE_TOOFAR_ARRR
    state->sane = !subvert;
    return Z_OK;
#else
    (void)subvert;
    state->sane = 1;
    return Z_DATA_ERROR;
#endif
}